

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O1

ElementPtr __thiscall
Rml::Factory::InstanceDocumentStream
          (Factory *this,Context *context,Stream *stream,String *document_base_tag)

{
  char *pcVar1;
  Element *root;
  long lVar2;
  ElementPtr element;
  XMLParser parser;
  Element *local_150;
  XMLParser local_148;
  
  local_148.super_BaseXMLParser._vptr_BaseXMLParser = (_func_int **)0x0;
  local_148.super_BaseXMLParser.source_url = (URL *)0x0;
  local_148.super_BaseXMLParser.xml_source._M_dataplus._M_p = (pointer)0x0;
  InstanceElement((Factory *)&local_150,(Element *)0x0,document_base_tag,document_base_tag,
                  (XMLAttributes *)&local_148);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)&local_148);
  root = local_150;
  if (local_150 == (Element *)0x0) {
    Log::Message(LT_ERROR,"Failed to instance document, instancer returned nullptr.");
  }
  else {
    lVar2 = __dynamic_cast(local_150,&Element::typeinfo,&ElementDocument::typeinfo,0);
    if (lVar2 != 0) {
      *(Context **)(lVar2 + 0x1d8) = context;
      XMLParser::XMLParser(&local_148,root);
      BaseXMLParser::Parse(&local_148.super_BaseXMLParser,stream);
      *(Element **)this = local_150;
      local_150 = (Element *)0x0;
      XMLParser::~XMLParser(&local_148);
      goto LAB_0023e44d;
    }
    pcVar1 = *(char **)((root->super_ScriptInterface).super_Releasable._vptr_Releasable[-1] + 8);
    Log::Message(LT_ERROR,
                 "Failed to instance document element. Found type \'%s\', was expecting derivative of ElementDocument."
                 ,pcVar1 + (*pcVar1 == '*'));
  }
  *(undefined8 *)this = 0;
LAB_0023e44d:
  if (local_150 != (Element *)0x0) {
    (*(local_150->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Factory::InstanceDocumentStream(Context* context, Stream* stream, const String& document_base_tag)
{
	RMLUI_ZoneScoped;

	ElementPtr element = Factory::InstanceElement(nullptr, document_base_tag, document_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document, instancer returned nullptr.");
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document element. Found type '%s', was expecting derivative of ElementDocument.",
			rmlui_type_name(*element));
		return nullptr;
	}

	document->context = context;

	XMLParser parser(element.get());
	parser.Parse(stream);

	return element;
}